

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

NeuralNetworkLayer *
google::protobuf::internal::GenericTypeHandler<CoreML::Specification::NeuralNetworkLayer>::New
          (Arena *arena)

{
  Arena *arena_local;
  NeuralNetworkLayer *local_28;
  NeuralNetworkLayer *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (NeuralNetworkLayer *)operator_new(0x90);
    CoreML::Specification::NeuralNetworkLayer::NeuralNetworkLayer(local_28);
  }
  else {
    local_28 = (NeuralNetworkLayer *)
               Arena::AllocateAligned
                         (arena,(type_info *)&CoreML::Specification::NeuralNetworkLayer::typeinfo,
                          0x90);
    CoreML::Specification::NeuralNetworkLayer::NeuralNetworkLayer(local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<CoreML::Specification::NeuralNetworkLayer>);
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }